

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

long __thiscall QByteArray::toLong(QByteArray *this,bool *ok,int base)

{
  undefined1 *puVar1;
  int in_R8D;
  long in_FS_OFFSET;
  QByteArrayView data;
  undefined1 local_38 [16];
  undefined1 *local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  data.m_data._0_4_ = base;
  data.m_size = (qsizetype)(this->d).ptr;
  data.m_data._4_4_ = 0;
  QtPrivate::toSignedInteger
            ((ParsedNumber<long_long> *)local_38,(QtPrivate *)(this->d).size,data,in_R8D);
  if (ok != (bool *)0x0) {
    *ok = (bool)((byte)local_38._8_8_ & 1 ^ 1);
  }
  puVar1 = (undefined1 *)local_38._0_8_;
  if ((local_38._8_8_ & 1) != 0) {
    puVar1 = (undefined1 *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return (long)puVar1;
}

Assistant:

long QByteArray::toLong(bool *ok, int base) const
{
    return QtPrivate::toIntegral<long>(qToByteArrayViewIgnoringNull(*this), ok, base);
}